

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var __thiscall cs::runtime_type::parse_gcnew(runtime_type *this,var *b)

{
  char *__s1;
  int iVar1;
  undefined4 extraout_var;
  undefined *puVar2;
  type_t *ptVar3;
  runtime_error *this_00;
  any *in_RDX;
  _Any_data local_38;
  undefined1 local_28 [16];
  
  if (in_RDX->mDat == (proxy *)0x0) {
    puVar2 = &void::typeinfo;
  }
  else {
    iVar1 = (*in_RDX->mDat->data->_vptr_baseHolder[2])();
    puVar2 = (undefined *)CONCAT44(extraout_var,iVar1);
  }
  __s1 = *(char **)(puVar2 + 8);
  if (__s1 != "N2cs6type_tE") {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,"N2cs6type_tE");
      if (iVar1 == 0) goto LAB_0015ef2a;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_38._M_unused._M_object = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Unsupported operator operations(GcNew).","");
    runtime_error::runtime_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
LAB_0015ef2a:
  ptVar3 = cs_impl::any::const_val<cs::type_t>(in_RDX);
  if ((ptVar3->constructor).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(ptVar3->constructor)._M_invoker)(&local_38);
    cs_impl::any::make<cs::pointer,cs_impl::any>((any *)this,(any *)&local_38);
    cs_impl::any::recycle((any *)&local_38);
    return (var)(proxy *)this;
  }
  std::__throw_bad_function_call();
}

Assistant:

var runtime_type::parse_gcnew(const var &b)
	{
		if (b.type() == typeid(type_t))
			return var::make<pointer>(b.const_val<type_t>().constructor());
		else
			throw runtime_error("Unsupported operator operations(GcNew).");
	}